

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_functions.c
# Opt level: O2

void WebRtcIsac_AutoCorr(double *r,double *x,size_t N,size_t order)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  
  lVar1 = 0;
  for (lVar3 = 0; lVar3 != order + 1; lVar3 = lVar3 + 1) {
    dVar5 = *x * x[lVar3];
    dVar4 = 0.0;
    for (uVar2 = 1; dVar4 = dVar4 + dVar5, uVar2 < N - lVar3; uVar2 = uVar2 + 1) {
      dVar5 = x[uVar2] * *(double *)((long)x + uVar2 * 8 + lVar1);
    }
    r[lVar3] = dVar4;
    lVar1 = lVar1 + 8;
  }
  return;
}

Assistant:

void WebRtcIsac_AutoCorr(double* r, const double* x, size_t N, size_t order) {
  size_t  lag, n;
  double sum, prod;
  const double *x_lag;

  for (lag = 0; lag <= order; lag++)
  {
    sum = 0.0f;
    x_lag = &x[lag];
    prod = x[0] * x_lag[0];
    for (n = 1; n < N - lag; n++) {
      sum += prod;
      prod = x[n] * x_lag[n];
    }
    sum += prod;
    r[lag] = sum;
  }

}